

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QObject_*(*)()>::relocate
          (QArrayDataPointer<QObject_*(*)()> *this,qsizetype offset,_func_QObject_ptr ***data)

{
  bool bVar1;
  _func_QObject_ptr **first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  _func_QObject_ptr **res;
  
  first = (_func_QObject_ptr **)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QObject*(*)(),long_long>
            (first,in_RDI,(_func_QObject_ptr **)0x450e47);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QObject*(*)()>,QObject*(*const*)()>
                        (data,(QArrayDataPointer<QObject_*(*)()> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(_func_QObject_ptr ***)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }